

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

bool __thiscall
CTypeCheckerVisitor::checkCyclicInheritance
          (CTypeCheckerVisitor *this,shared_ptr<ClassInfo> *startClass,
          shared_ptr<ClassInfo> *currentClass)

{
  bool bVar1;
  __type _Var2;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  bVar1 = std::operator==(&((currentClass->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->baseClass,"");
  if (bVar1) {
    bVar1 = false;
  }
  else {
    _Var2 = std::operator==(&((currentClass->
                              super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                             baseClass,
                            &((startClass->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->name);
    bVar1 = true;
    if (!_Var2) {
      std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&startClass->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>);
      p_Var3 = &std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)(this->table).
                                super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             &((currentClass->
                               super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                              baseClass)->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_30,p_Var3);
      bVar1 = checkCyclicInheritance
                        (this,(shared_ptr<ClassInfo> *)&local_40,(shared_ptr<ClassInfo> *)&local_30)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
  }
  return bVar1;
}

Assistant:

bool CTypeCheckerVisitor::checkCyclicInheritance(std::shared_ptr<ClassInfo> startClass,
                                                 std::shared_ptr<ClassInfo> currentClass) {
    if( currentClass->baseClass == "" ) {
        return false;
    }
    if( currentClass->baseClass == startClass->name )
    {
        return true;
    }
    return checkCyclicInheritance( startClass, table->classes[currentClass->baseClass]);
}